

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O1

intb __thiscall TokenField::getValue(TokenField *this,ParserWalker *walker)

{
  bool bVar1;
  uintm uVar2;
  uint size;
  uint size_00;
  int iVar3;
  intb res;
  ulong local_38;
  
  iVar3 = this->bytestart;
  bVar1 = this->bigendian;
  local_38 = 0;
  size = (this->byteend - iVar3) + 1;
  for (size_00 = size; 3 < size_00; size_00 = size_00 - 4) {
    uVar2 = ParserContext::getInstructionBytes(walker->const_context,iVar3,4,walker->point->offset);
    local_38 = (ulong)uVar2 | local_38 << 0x20;
    iVar3 = iVar3 + 4;
  }
  if (size_00 != 0) {
    uVar2 = ParserContext::getInstructionBytes
                      (walker->const_context,iVar3,size_00,walker->point->offset);
    local_38 = (ulong)uVar2 | local_38 << ((byte)(size_00 << 3) & 0x3f);
  }
  if (bVar1 == false) {
    byte_swap((intb *)&local_38,size);
  }
  local_38 = (long)local_38 >> ((byte)this->shift & 0x3f);
  iVar3 = this->bitend - this->bitstart;
  if (this->signbit == true) {
    sign_extend((intb *)&local_38,iVar3);
  }
  else {
    zero_extend((intb *)&local_38,iVar3);
  }
  return local_38;
}

Assistant:

intb TokenField::getValue(ParserWalker &walker) const

{				// Construct value given specific instruction stream
  intb res = getInstructionBytes(walker,bytestart,byteend,bigendian);
  
  res >>= shift;
  if (signbit)
    sign_extend(res,bitend-bitstart);
  else
    zero_extend(res,bitend-bitstart);
  return res;
}